

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O1

void Dch_ClassesCollectConst1Group(Dch_Cla_t *p,Aig_Obj_t *pObj,int nNodes,Vec_Ptr_t *vRoots)

{
  uint uVar1;
  Aig_Man_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Aig_Obj_t *pAVar5;
  uint uVar6;
  void *pvVar7;
  int iVar8;
  uint uVar9;
  
  vRoots->nSize = 0;
  uVar9 = pObj->Id;
  uVar1 = p->pAig->vObjs->nSize;
  uVar6 = nNodes + uVar9;
  if ((int)uVar1 <= (int)(nNodes + uVar9)) {
    uVar6 = uVar1;
  }
  if ((int)uVar9 < (int)uVar6) {
    do {
      pAVar2 = p->pAig;
      pVVar3 = pAVar2->vObjs;
      if (pVVar3 == (Vec_Ptr_t *)0x0) {
        pvVar7 = (void *)0x0;
      }
      else {
        if (((int)uVar9 < 0) || (pVVar3->nSize <= (int)uVar9)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar7 = pVVar3->pArray[uVar9];
      }
      if (pvVar7 != (void *)0x0) {
        if (pAVar2->pReprs == (Aig_Obj_t **)0x0) {
          pAVar5 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar5 = pAVar2->pReprs[*(int *)((long)pvVar7 + 0x24)];
        }
        if (pAVar5 == pAVar2->pConst1) {
          uVar1 = vRoots->nCap;
          if (vRoots->nSize == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (vRoots->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(vRoots->pArray,0x80);
              }
              vRoots->pArray = ppvVar4;
              iVar8 = 0x10;
            }
            else {
              iVar8 = uVar1 * 2;
              if (iVar8 <= (int)uVar1) goto LAB_005e3a71;
              if (vRoots->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar4 = (void **)realloc(vRoots->pArray,(ulong)uVar1 << 4);
              }
              vRoots->pArray = ppvVar4;
            }
            vRoots->nCap = iVar8;
          }
LAB_005e3a71:
          iVar8 = vRoots->nSize;
          vRoots->nSize = iVar8 + 1;
          vRoots->pArray[iVar8] = pvVar7;
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar6 != uVar9);
  }
  return;
}

Assistant:

void Dch_ClassesCollectConst1Group( Dch_Cla_t * p, Aig_Obj_t * pObj, int nNodes, Vec_Ptr_t * vRoots )
{
    int i, Limit;
    Vec_PtrClear( vRoots );
    Limit = Abc_MinInt( pObj->Id + nNodes, Aig_ManObjNumMax(p->pAig) );
    for ( i = pObj->Id; i < Limit; i++ )
    {
        pObj = Aig_ManObj( p->pAig, i );
        if ( pObj && Dch_ObjIsConst1Cand( p->pAig, pObj ) )
            Vec_PtrPush( vRoots, pObj );
    }
}